

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O2

void __thiscall libtorrent::peer_connection::second_tick(peer_connection *this,int tick_interval_ms)

{
  undefined1 *puVar1;
  byte bVar2;
  byte bVar3;
  int32_t iVar4;
  session_interface *psVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  bool bVar8;
  bool bVar9;
  uint uVar10;
  uint uVar11;
  piece_index_t new_piece;
  int iVar12;
  int iVar13;
  alert_manager *paVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint uVar15;
  _List_node_base *p_Var16;
  long lVar17;
  long lVar18;
  shared_ptr<libtorrent::torrent> t;
  undefined1 local_60 [32];
  shared_ptr<libtorrent::peer_connection> me;
  
  local_60._28_4_ = tick_interval_ms;
  local_60._16_8_ = aux::time_now();
  std::__shared_ptr<libtorrent::peer_connection,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libtorrent::peer_connection,void>
            ((__shared_ptr<libtorrent::peer_connection,(__gnu_cxx::_Lock_policy)2> *)&me,
             (__weak_ptr<libtorrent::peer_connection,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<libtorrent::peer_connection>);
  std::__shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&t.super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>,
             &(this->super_peer_connection_hot_members).m_torrent);
  bVar8 = aux::session_settings::get_bool
                    ((this->super_peer_connection_hot_members).m_settings,0x8010);
  if (bVar8) {
    if (t.super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      psVar5 = (this->super_peer_connection_hot_members).m_ses;
      uVar10 = (*(psVar5->super_session_logger)._vptr_session_logger[0x34])
                         (psVar5,&(this->super_peer_connection_hot_members).field_0x2c,
                          (ulong)(uint)(this->m_statistics).m_stat[5].m_counter,
                          (ulong)(uint)(this->m_statistics).m_stat[4].m_counter);
      psVar5 = (this->super_peer_connection_hot_members).m_ses;
      uVar11 = (*(psVar5->super_session_logger)._vptr_session_logger[0x34])
                         (psVar5,&(t.
                                   super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->super_peer_class_set,
                          (ulong)(uint)(this->m_statistics).m_stat[5].m_counter,
                          (ulong)(uint)(this->m_statistics).m_stat[4].m_counter);
      if ((uVar11 | uVar10) != 0) {
        paVar14 = torrent::alerts(t.
                                  super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
        if (((paVar14->m_alert_mask)._M_i.m_val >> 9 & 1) != 0) {
          for (uVar15 = 0; uVar15 != 2; uVar15 = uVar15 + 1) {
            if (((uVar11 | uVar10) >> (uVar15 & 0x1f) & 1) != 0) {
              paVar14 = torrent::alerts(t.
                                        super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr);
              torrent::get_handle((torrent *)local_60);
              local_60._24_4_ = uVar15 == 1 | 2;
              alert_manager::
              emplace_alert<libtorrent::performance_alert,libtorrent::torrent_handle,libtorrent::performance_alert::performance_warning_t>
                        (paVar14,(torrent_handle *)local_60,
                         (performance_warning_t *)(local_60 + 0x18));
              std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                        ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
            }
          }
        }
      }
      goto LAB_001e21ca;
    }
  }
  else {
LAB_001e21ca:
    if ((t.super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
         (element_type *)0x0) &&
       (bVar2 = (this->super_peer_connection_hot_members).field_0x28, (bVar2 & 1) == 0)) {
      if (((~bVar2 & 0x14) == 0) &&
         ((((this->m_download_queue).
            super_vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>.
            super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            (this->m_download_queue).
            super_vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>.
            super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
            ._M_impl.super__Vector_impl_data._M_finish &&
           ((this->m_request_queue).
            super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            (this->m_request_queue).
            super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
            ._M_impl.super__Vector_impl_data._M_finish)) &&
          ((this->m_last_request).__d.__r <=
           (long)&((element_type *)(local_60._16_8_ + -0x12a05f340))->m_owned_collections)))) {
        (this->m_last_request).__d.__r = local_60._16_8_;
        bVar8 = request_a_block(t.
                                super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr,this);
        if (bVar8) {
          counters::inc_stats_counter(this->m_counters,0x1f,1);
        }
        if (((this->super_peer_connection_hot_members).field_0x28 & 1) != 0) goto LAB_001e2240;
        send_block_requests(this);
      }
      if (((((t.super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             field_0x5b0 & 8) != 0) &&
          ((((t.super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_torrent_hot_members).field_0x3b & 2) != 0)) &&
         (((this->field_0x763 & 1) == 0 &&
          ((this->m_became_uninterested).__d.__r + 10000000000 < (long)local_60._16_8_)))) {
        new_piece = torrent::get_piece_to_super_seed
                              (t.super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr,&(this->super_peer_connection_hot_members).m_have_piece);
        superseed_piece(this,(piece_index_t)0xffffffff,new_piece);
      }
      (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x2f])(this);
      iVar12 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[1])(this);
      if ((char)iVar12 != '\0') goto LAB_001e2240;
      p_Var16 = (_List_node_base *)&this->m_extensions;
      while (p_Var16 = (((_List_base<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
                          *)&p_Var16->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var16 != (_List_node_base *)&this->m_extensions) {
        (**(code **)(*(long *)p_Var16[1]._M_next + 0xf0))();
      }
      iVar12 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[1])(this);
      uVar7 = local_60._16_8_;
      if ((char)iVar12 != '\0') goto LAB_001e2240;
      lVar17 = local_60._16_8_ - (this->m_last_receive).__d.__r;
      if (((this->super_peer_connection_hot_members).field_0x28 & 2) != 0) {
        iVar12 = aux::session_settings::get_int
                           ((this->super_peer_connection_hot_members).m_settings,0x4011);
        if (this->m_peer_info != (torrent_peer *)0x0) {
          iVar12 = (*(uint *)&this->m_peer_info->field_0x1b & 0x1f) * 3 + iVar12;
        }
        bVar8 = aux::is_ssl((this->m_socket).
                            super___shared_ptr<libtorrent::aux::socket_type,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr);
        bVar9 = aux::is_i2p((this->m_socket).
                            super___shared_ptr<libtorrent::aux::socket_type,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr);
        iVar13 = iVar12 + 10;
        if (!bVar8) {
          iVar13 = iVar12;
        }
        iVar12 = iVar13 + 0x14;
        if (!bVar9) {
          iVar12 = iVar13;
        }
        if ((long)iVar12 * 1000000000 < lVar17) {
          boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                    ((error_code *)local_60,timed_out,(type *)0x0);
          bVar8 = can_disconnect(this,(error_code *)local_60);
          if (bVar8) {
            peer_log(this,info,"CONNECT_FAILED","waited %d seconds",lVar17 / 1000000000 & 0xffffffff
                    );
            boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                      ((error_code *)local_60,timed_out,(type *)0x0);
            connect_failed(this,(error_code *)local_60);
            goto LAB_001e2240;
          }
        }
      }
      bVar2 = this->m_channel_state[1].m_val;
      if ((bVar2 & 4) != 0) {
        iVar12 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x33])(this);
        if ((((long)iVar12 * 1000000000 < lVar17) &&
            (((this->super_peer_connection_hot_members).field_0x28 & 2) == 0)) &&
           (this->m_reading_bytes == 0)) {
          boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                    ((error_code *)local_60,timed_out_inactivity,(type *)0x0);
          bVar8 = can_disconnect(this,(error_code *)local_60);
          if (bVar8) {
            peer_log(this,info,"LAST_ACTIVITY","%d seconds ago",lVar17 / 1000000000 & 0xffffffff);
            boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                      ((error_code *)local_60,timed_out_inactivity,(type *)0x0);
            (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])
                      (this,(error_code *)local_60,1,0);
            goto LAB_001e2240;
          }
        }
      }
      iVar12 = aux::session_settings::get_int
                         ((this->super_peer_connection_hot_members).m_settings,0x401b);
      bVar8 = aux::is_i2p((this->m_socket).
                          super___shared_ptr<libtorrent::aux::socket_type,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr);
      if (((bVar2 & 4) != 0) && (((this->super_peer_connection_hot_members).field_0x28 & 2) == 0)) {
        iVar13 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x1b])(this);
        if (((char)iVar13 != '\0') && ((long)(iVar12 << bVar8 * '\x02') * 1000000000 < lVar17)) {
          peer_log(this,info,"NO_HANDSHAKE","waited %d seconds",lVar17 / 1000000000 & 0xffffffff);
          boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                    ((error_code *)local_60,timed_out_no_handshake,(type *)0x0);
          (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])
                    (this,(error_code *)local_60,1,0);
          goto LAB_001e2240;
        }
      }
      lVar17 = (this->m_last_incoming_request).__d.__r;
      lVar18 = (this->m_last_unchoke).__d.__r;
      if (lVar17 < lVar18) {
        lVar17 = lVar18;
      }
      lVar18 = (this->m_last_sent_payload).__d.__r;
      if (lVar17 <= lVar18) {
        lVar17 = lVar18;
      }
      if ((((((bVar2 & 4) != 0) &&
            (bVar3 = (this->super_peer_connection_hot_members).field_0x28, (bVar3 & 2) == 0)) &&
           ((bVar3 & 0x20) == 0)) &&
          (((this->m_requests).
            super_vector<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>.
            super__Vector_base<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            (this->m_requests).
            super_vector<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>.
            super__Vector_base<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>.
            _M_impl.super__Vector_impl_data._M_finish && (this->m_reading_bytes == 0)))) &&
         (((this->field_0x763 & 1) != 0 &&
          (t.super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
           (element_type *)0x0)))) {
        bVar8 = torrent::is_upload_only
                          (t.super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
        if (bVar8 && 60000000000 < uVar7 - lVar17) {
          boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                    ((error_code *)local_60,timed_out_no_request,(type *)0x0);
          bVar8 = can_disconnect(this,(error_code *)local_60);
          if (bVar8) {
            auVar6._8_8_ = 0;
            auVar6._0_8_ = uVar7 - lVar17;
            peer_log(this,info,"NO_REQUEST","waited %d seconds",
                     (ulong)SUB164(auVar6 / ZEXT816(1000000000),0));
            boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                      ((error_code *)local_60,timed_out_no_request,(type *)0x0);
            (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])
                      (this,(error_code *)local_60,1,0);
            goto LAB_001e2240;
          }
        }
      }
      lVar17 = uVar7 - (this->m_became_uninterested).__d.__r;
      lVar18 = uVar7 - (this->m_became_uninteresting).__d.__r;
      iVar12 = aux::session_settings::get_int
                         ((this->super_peer_connection_hot_members).m_settings,0x4013);
      if ((bVar2 & 4) != 0) {
        if (((this->super_peer_connection_hot_members).field_0x28 & 0x10) == 0) {
          if (((long)iVar12 * 1000000000 < lVar18 &
              (long)iVar12 * 1000000000 < lVar17 & ~this->field_0x763) == 1) {
            iVar12 = (*(((this->super_peer_connection_hot_members).m_ses)->super_session_logger).
                       _vptr_session_logger[0x1e])();
            iVar13 = aux::session_settings::get_int
                               ((this->super_peer_connection_hot_members).m_settings,0x4055);
            if (iVar12 < iVar13) {
              if (t.super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)0x0) {
                iVar12 = torrent::num_peers(t.
                                            super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr);
                if ((int)((uint)((ulong)*(undefined8 *)
                                         &((t.
                                            super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->super_torrent_hot_members).field_0x38 >> 0x21)
                         & 0xffffff) <= iVar12) goto LAB_001e2a23;
              }
            }
            else {
LAB_001e2a23:
              boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                        ((error_code *)local_60,timed_out_no_interest,(type *)0x0);
              bVar8 = can_disconnect(this,(error_code *)local_60);
              if (bVar8) {
                iVar12 = (*(((this->super_peer_connection_hot_members).m_ses)->super_session_logger)
                           ._vptr_session_logger[5])();
                if ((short)*(undefined4 *)(CONCAT44(extraout_var_01,iVar12) + 0x68) < 0) {
                  peer_log(this,info,"MUTUAL_NO_INTEREST","t1: %d t2: %d",lVar17 / 1000000000,
                           lVar18 / 1000000000 & 0xffffffff);
                }
                boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                          ((error_code *)local_60,timed_out_no_interest,(type *)0x0);
                (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])
                          (this,(error_code *)local_60,1,0);
                goto LAB_001e2240;
              }
            }
          }
        }
        if (((this->m_download_queue).
             super_vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>.
             super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (this->m_download_queue).
             super_vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>.
             super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
             ._M_impl.super__Vector_impl_data._M_finish) && (0 < this->m_quota[1])) {
          iVar12 = request_timeout(this);
          if ((long)iVar12 * 1000000000 + (this->m_requested).__d.__r < (long)local_60._16_8_) {
            snub_peer(this);
          }
        }
      }
      keep_alive(this);
      if (((((this->field_0x763 & 0x10) != 0) && ((this->field_0x762 & 0x40) == 0)) &&
          (0 < this->m_downloaded_last_second)) &&
         ((this->m_statistics).m_stat[2].m_counter <= this->m_downloaded_last_second + 5000)) {
        this->field_0x763 = this->field_0x763 & 0xef;
        iVar12 = (*(((this->super_peer_connection_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[5])();
        if ((short)*(undefined4 *)(CONCAT44(extraout_var,iVar12) + 0x68) < 0) {
          peer_log(this,info,"SLOW_START","exit slow start: prev-dl: %d dl: %d",
                   (ulong)(uint)this->m_downloaded_last_second,
                   (ulong)(uint)(this->m_statistics).m_stat[2].m_counter);
        }
      }
      iVar4 = (this->m_statistics).m_stat[0].m_counter;
      this->m_downloaded_last_second = (this->m_statistics).m_stat[2].m_counter;
      this->m_uploaded_last_second = iVar4;
      stat::second_tick(&this->m_statistics,local_60._28_4_);
      iVar12 = (this->m_statistics).m_stat[0].m_5_sec_average;
      if (this->m_upload_rate_peak < iVar12) {
        this->m_upload_rate_peak = iVar12;
      }
      iVar12 = (this->m_statistics).m_stat[2].m_5_sec_average;
      if (this->m_download_rate_peak < iVar12) {
        this->m_download_rate_peak = iVar12;
      }
      iVar12 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[1])(this);
      if (((char)iVar12 == '\0') &&
         ((((t.super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_torrent_hot_members).field_0x3b & 2) != 0)) {
        update_desired_queue_size(this);
        if (this->m_max_out_request_queue == (uint)this->m_desired_queue_size) {
          paVar14 = torrent::alerts(t.
                                    super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr);
          if (((paVar14->m_alert_mask)._M_i.m_val >> 9 & 1) != 0) {
            paVar14 = torrent::alerts(t.
                                      super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr);
            torrent::get_handle((torrent *)local_60);
            local_60._24_4_ = 1;
            alert_manager::
            emplace_alert<libtorrent::performance_alert,libtorrent::torrent_handle,libtorrent::performance_alert::performance_warning_t>
                      (paVar14,(torrent_handle *)local_60,(performance_warning_t *)(local_60 + 0x18)
                      );
            std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                      ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
          }
        }
        iVar12 = aux::session_settings::get_int
                           ((this->super_peer_connection_hot_members).m_settings,0x4004);
        if ((((this->m_download_queue).
              super_vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>.
              super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (this->m_download_queue).
              super_vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>.
              super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
              ._M_impl.super__Vector_impl_data._M_finish) && (0 < this->m_quota[1])) &&
           ((long)iVar12 * 1000000000 < local_60._16_8_ - (this->m_last_piece).__d.__r)) {
          iVar13 = (*(((this->super_peer_connection_hot_members).m_ses)->super_session_logger).
                     _vptr_session_logger[5])();
          if ((short)*(undefined4 *)(CONCAT44(extraout_var_00,iVar13) + 0x68) < 0) {
            peer_log(this,info,"PIECE_REQUEST_TIMED_OUT","%d time: %d to: %d",
                     ((long)(this->m_download_queue).
                            super_vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
                            .
                            super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->m_download_queue).
                           super_vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
                           .
                           super__Vector_base<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0xc,
                     (local_60._16_8_ - (this->m_last_piece).__d.__r) / 1000000000 & 0xffffffff,
                     iVar12);
          }
          snub_peer(this);
        }
        fill_send_buffer(this);
      }
      goto LAB_001e2240;
    }
  }
  if (((this->super_peer_connection_hot_members).field_0x28 & 2) != 0) {
    counters::inc_stats_counter(this->m_counters,0xe4,-1);
    if (t.super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      torrent::dec_num_connecting
                (t.super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 this->m_peer_info);
    }
    puVar1 = &(this->super_peer_connection_hot_members).field_0x28;
    *puVar1 = *puVar1 & 0xfd;
  }
  boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
            ((error_code *)local_60,torrent_aborted,(type *)0x0);
  (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,(error_code *)local_60,1,0);
LAB_001e2240:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&t.super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&me.super___shared_ptr<libtorrent::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void peer_connection::second_tick(int const tick_interval_ms)
	{
		TORRENT_ASSERT(is_single_thread());
		time_point const now = aux::time_now();
		std::shared_ptr<peer_connection> me(self());

		// the invariant check must be run before me is destructed
		// in case the peer got disconnected
		INVARIANT_CHECK;

		std::shared_ptr<torrent> t = m_torrent.lock();

		int warning = 0;
		// drain the IP overhead from the bandwidth limiters
		if (m_settings.get_bool(settings_pack::rate_limit_ip_overhead) && t)
		{
			warning |= m_ses.use_quota_overhead(*this, m_statistics.download_ip_overhead()
				, m_statistics.upload_ip_overhead());
			warning |= m_ses.use_quota_overhead(*t, m_statistics.download_ip_overhead()
				, m_statistics.upload_ip_overhead());
		}

		if (warning && t->alerts().should_post<performance_alert>())
		{
			for (int channel = 0; channel < 2; ++channel)
			{
				if ((warning & (1 << channel)) == 0) continue;
				t->alerts().emplace_alert<performance_alert>(t->get_handle()
					, channel == peer_connection::download_channel
					? performance_alert::download_limit_too_low
					: performance_alert::upload_limit_too_low);
			}
		}

		if (!t || m_disconnecting)
		{
			TORRENT_ASSERT(t || !m_connecting);
			if (m_connecting)
			{
				m_counters.inc_stats_counter(counters::num_peers_half_open, -1);
				if (t) t->dec_num_connecting(m_peer_info);
				m_connecting = false;
			}
			disconnect(errors::torrent_aborted, operation_t::bittorrent);
			return;
		}

		if (m_endgame_mode
			&& m_interesting
			&& m_download_queue.empty()
			&& m_request_queue.empty()
			&& now - seconds(5) >= m_last_request)
		{
			// this happens when we're in strict end-game
			// mode and the peer could not request any blocks
			// because they were all taken but there were still
			// unrequested blocks. Now, 5 seconds later, there
			// might not be any unrequested blocks anymore, so
			// we should try to pick another block to see
			// if we can pick a busy one
			m_last_request = now;
			if (request_a_block(*t, *this))
				m_counters.inc_stats_counter(counters::end_game_piece_picks);
			if (m_disconnecting) return;
			send_block_requests();
		}

#ifndef TORRENT_DISABLE_SUPERSEEDING
		if (t->super_seeding()
			&& t->ready_for_connections()
			&& !m_peer_interested
			&& m_became_uninterested + seconds(10) < now)
		{
			// maybe we need to try another piece, to see if the peer
			// become interested in us then
			superseed_piece(piece_index_t(-1), t->get_piece_to_super_seed(m_have_piece));
		}
#endif

		on_tick();
		if (is_disconnecting()) return;

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto const& e : m_extensions)
		{
			e->tick();
		}
		if (is_disconnecting()) return;
#endif

		// if the peer hasn't said a thing for a certain
		// time, it is considered to have timed out
		time_duration d = now - m_last_receive;

		if (m_connecting)
		{
			int connect_timeout = m_settings.get_int(settings_pack::peer_connect_timeout);
			if (m_peer_info) connect_timeout += 3 * m_peer_info->failcount;

			// SSL and i2p handshakes are slow
			if (is_ssl(*m_socket))
				connect_timeout += 10;

#if TORRENT_USE_I2P
			if (is_i2p(*m_socket))
				connect_timeout += 20;
#endif

			if (d > seconds(connect_timeout)
				&& can_disconnect(errors::timed_out))
			{
#ifndef TORRENT_DISABLE_LOGGING
				peer_log(peer_log_alert::info, "CONNECT_FAILED", "waited %d seconds"
					, int(total_seconds(d)));
#endif
				connect_failed(errors::timed_out);
				return;
			}
		}

		// if we can't read, it means we're blocked on the rate-limiter
		// or the disk, not the peer itself. In this case, don't blame
		// the peer and disconnect it
		bool const may_timeout = bool(m_channel_state[download_channel] & peer_info::bw_network);

		// TODO: 2 use a deadline_timer for timeouts. Don't rely on second_tick()!
		// Hook this up to connect timeout as well. This would improve performance
		// because of less work in second_tick(), and might let use remove ticking
		// entirely eventually
		if (may_timeout && d > seconds(timeout()) && !m_connecting && m_reading_bytes == 0
			&& can_disconnect(errors::timed_out_inactivity))
		{
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "LAST_ACTIVITY", "%d seconds ago"
				, int(total_seconds(d)));
#endif
			disconnect(errors::timed_out_inactivity, operation_t::bittorrent);
			return;
		}

		// do not stall waiting for a handshake
		int timeout = m_settings.get_int (settings_pack::handshake_timeout);
#if TORRENT_USE_I2P
		timeout *= is_i2p(*m_socket) ? 4 : 1;
#endif
		if (may_timeout
			&& !m_connecting
			&& in_handshake()
			&& d > seconds(timeout))
		{
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "NO_HANDSHAKE", "waited %d seconds"
				, int(total_seconds(d)));
#endif
			disconnect(errors::timed_out_no_handshake, operation_t::bittorrent);
			return;
		}

		// disconnect peers that we unchoked, but they didn't send a request in
		// the last 60 seconds, and we haven't been working on servicing a request
		// for more than 60 seconds.
		// but only if we're a seed
		d = now - std::max(std::max(m_last_unchoke, m_last_incoming_request)
			, m_last_sent_payload);

		if (may_timeout
			&& !m_connecting
			&& m_requests.empty()
			&& m_reading_bytes == 0
			&& !m_choked
			&& m_peer_interested
			&& t && t->is_upload_only()
			&& d > seconds(60)
			&& can_disconnect(errors::timed_out_no_request))
		{
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "NO_REQUEST", "waited %d seconds"
				, int(total_seconds(d)));
#endif
			disconnect(errors::timed_out_no_request, operation_t::bittorrent);
			return;
		}

		// if the peer hasn't become interested and we haven't
		// become interested in the peer for 10 minutes, it
		// has also timed out.
		time_duration const d1 = now - m_became_uninterested;
		time_duration const d2 = now - m_became_uninteresting;
		time_duration const time_limit = seconds(
			m_settings.get_int(settings_pack::inactivity_timeout));

		// don't bother disconnect peers we haven't been interested
		// in (and that hasn't been interested in us) for a while
		// unless we have used up all our connection slots
		if (may_timeout
			&& !m_interesting
			&& !m_peer_interested
			&& d1 > time_limit
			&& d2 > time_limit
			&& (m_ses.num_connections() >= m_settings.get_int(settings_pack::connections_limit)
				|| (t && t->num_peers() >= t->max_connections()))
			&& can_disconnect(errors::timed_out_no_interest))
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log(peer_log_alert::info))
			{
				peer_log(peer_log_alert::info, "MUTUAL_NO_INTEREST", "t1: %d t2: %d"
					, int(total_seconds(d1)), int(total_seconds(d2)));
			}
#endif
			disconnect(errors::timed_out_no_interest, operation_t::bittorrent);
			return;
		}

		if (may_timeout
			&& !m_download_queue.empty()
			&& m_quota[download_channel] > 0
			&& now > m_requested + seconds(request_timeout()))
		{
			snub_peer();
		}

		// if we haven't sent something in too long, send a keep-alive
		keep_alive();

		// if our download rate isn't increasing significantly anymore, end slow
		// start. The 10kB is to have some slack here.
		// we can't do this when we're choked, because we aren't sending any
		// requests yet, so there hasn't been an opportunity to ramp up the
		// connection yet.
		if (m_slow_start
			&& !m_peer_choked
			&& m_downloaded_last_second > 0
			&& m_downloaded_last_second + 5000
				>= m_statistics.last_payload_downloaded())
		{
			m_slow_start = false;
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log(peer_log_alert::info))
			{
				peer_log(peer_log_alert::info, "SLOW_START", "exit slow start: "
					"prev-dl: %d dl: %d"
					, int(m_downloaded_last_second)
					, m_statistics.last_payload_downloaded());
			}
#endif
		}
		m_downloaded_last_second = m_statistics.last_payload_downloaded();
		m_uploaded_last_second = m_statistics.last_payload_uploaded();

		m_statistics.second_tick(tick_interval_ms);

		if (m_statistics.upload_payload_rate() > m_upload_rate_peak)
		{
			m_upload_rate_peak = m_statistics.upload_payload_rate();
		}
		if (m_statistics.download_payload_rate() > m_download_rate_peak)
		{
			m_download_rate_peak = m_statistics.download_payload_rate();
		}
		if (is_disconnecting()) return;

		if (!t->ready_for_connections()) return;

		update_desired_queue_size();

		if (m_desired_queue_size == m_max_out_request_queue
			&& t->alerts().should_post<performance_alert>())
		{
			t->alerts().emplace_alert<performance_alert>(t->get_handle()
				, performance_alert::outstanding_request_limit_reached);
		}

		int const piece_timeout = m_settings.get_int(settings_pack::piece_timeout);

		if (!m_download_queue.empty()
			&& m_quota[download_channel] > 0
			&& now - m_last_piece > seconds(piece_timeout))
		{
			// this peer isn't sending the pieces we've
			// requested (this has been observed by BitComet)
			// in this case we'll clear our download queue and
			// re-request the blocks.
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log(peer_log_alert::info))
			{
				peer_log(peer_log_alert::info, "PIECE_REQUEST_TIMED_OUT"
					, "%d time: %d to: %d"
					, int(m_download_queue.size()), int(total_seconds(now - m_last_piece))
					, piece_timeout);
			}
#endif

			snub_peer();
		}

		fill_send_buffer();
	}